

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O3

void __thiscall MainWindow::onResize(MainWindow *this,int w,int h,StateChange sc)

{
  Pixmap PVar1;
  
  if ((sc != Minimized) && ((this->window).size.h != h || (this->window).size.w != w)) {
    puts("realloc buffers");
    if (this->bmp != 0) {
      XFreePixmap((this->window).display);
    }
    printf("Renderer resize %i %i\n",(ulong)(uint)w,(ulong)(uint)h);
    std::vector<Color,_std::allocator<Color>_>::resize
              ((vector<Color,_std::allocator<Color>_> *)&this->renderer,(long)w * (long)h);
    (this->renderer).backbuffer.w = w;
    (this->renderer).backbuffer.h = h;
    (this->window).size.w = w;
    (this->window).size.h = h;
    PVar1 = XCreatePixmap((this->window).display,(this->window).handle,w,h,(this->window).depth);
    this->bmp = PVar1;
  }
  std::function<void_(int,_int,_StateChange)>::operator()(&this->onAppResize,w,h,sc);
  return;
}

Assistant:

void onResize(int w, int h, StateChange sc)
	{
		//printf("resize\n");
		bool m = (w == width()) && (h == height());
		if(!m && sc != StateChange::Minimized)
		{
			printf("realloc buffers\n");
			free_buffers();
			renderer.resize(w, h);
			window.size.w = w; window.size.h = h;
			allocate_buffers();
			
		}
		onAppResize(w, h, sc);
		if(!m)
		{
			//printf("stepping and redrawing\n");
			//onAppStep();
			//window.redraw();
		}
	}